

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void google::protobuf::PlanAllocationSize
               (RepeatedPtrField<google::protobuf::DescriptorProto> *messages,
               size_t parent_scope_size,FlatAllocator *alloc)

{
  bool bVar1;
  int iVar2;
  reference this;
  long lVar3;
  RepeatedPtrField<google::protobuf::DescriptorProto> *messages_00;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *pRVar4;
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *ranges;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *enums;
  RepeatedPtrField<google::protobuf::OneofDescriptorProto> *oneofs;
  size_t local_58;
  size_t full_name_size;
  DescriptorProto *message;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::DescriptorProto> *__range2;
  FlatAllocator *alloc_local;
  size_t parent_scope_size_local;
  RepeatedPtrField<google::protobuf::DescriptorProto> *messages_local;
  
  iVar2 = RepeatedPtrField<google::protobuf::DescriptorProto>::size(messages);
  anon_unknown_24::
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ::PlanArray<google::protobuf::Descriptor>
            (&alloc->
              super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ,iVar2);
  __end2 = RepeatedPtrField<google::protobuf::DescriptorProto>::begin(messages);
  message = (DescriptorProto *)RepeatedPtrField<google::protobuf::DescriptorProto>::end(messages);
  while (bVar1 = internal::operator!=(&__end2,(iterator *)&message), bVar1) {
    this = internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::operator*
                     (&__end2);
    if (parent_scope_size == 0) {
      DescriptorProto::name_abi_cxx11_(this);
      local_58 = std::__cxx11::string::size();
    }
    else {
      DescriptorProto::name_abi_cxx11_(this);
      lVar3 = std::__cxx11::string::size();
      local_58 = parent_scope_size + 1 + lVar3;
    }
    anon_unknown_24::
    FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ::PlanEntityNames(&alloc->
                       super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                      ,local_58);
    bVar1 = DescriptorProto::has_options(this);
    if (bVar1) {
      anon_unknown_24::
      FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ::PlanArray<google::protobuf::MessageOptions>
                (&alloc->
                  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                 ,1);
    }
    messages_00 = DescriptorProto::nested_type(this);
    PlanAllocationSize(messages_00,local_58,alloc);
    pRVar4 = DescriptorProto::field(this);
    PlanAllocationSize(pRVar4,local_58,alloc);
    pRVar4 = DescriptorProto::extension(this);
    PlanAllocationSize(pRVar4,local_58,alloc);
    ranges = DescriptorProto::extension_range(this);
    PlanAllocationSize(ranges,alloc);
    iVar2 = DescriptorProto::reserved_range_size(this);
    anon_unknown_24::
    FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ::PlanArray<google::protobuf::Descriptor::ReservedRange>
              (&alloc->
                super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ,iVar2);
    iVar2 = DescriptorProto::reserved_name_size(this);
    (anonymous_namespace)::
    FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
    ::PlanArray<std::__cxx11::string_const*>
              ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                *)alloc,iVar2);
    iVar2 = DescriptorProto::reserved_name_size(this);
    (anonymous_namespace)::
    FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
    ::PlanArray<std::__cxx11::string>
              ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                *)alloc,iVar2);
    enums = DescriptorProto::enum_type(this);
    PlanAllocationSize(enums,local_58,alloc);
    oneofs = DescriptorProto::oneof_decl(this);
    PlanAllocationSize(oneofs,local_58,alloc);
    internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::operator++(&__end2);
  }
  return;
}

Assistant:

static void PlanAllocationSize(
    const RepeatedPtrField<DescriptorProto>& messages, size_t parent_scope_size,
    internal::FlatAllocator& alloc) {
  alloc.PlanArray<Descriptor>(messages.size());

  for (const auto& message : messages) {
    const size_t full_name_size =
        parent_scope_size ? parent_scope_size + 1 + message.name().size()
                          : message.name().size();
    alloc.PlanEntityNames(full_name_size);

    if (message.has_options()) alloc.PlanArray<MessageOptions>(1);
    PlanAllocationSize(message.nested_type(), full_name_size, alloc);
    PlanAllocationSize(message.field(), full_name_size, alloc);
    PlanAllocationSize(message.extension(), full_name_size, alloc);
    PlanAllocationSize(message.extension_range(), alloc);
    alloc.PlanArray<Descriptor::ReservedRange>(message.reserved_range_size());
    alloc.PlanArray<const std::string*>(message.reserved_name_size());
    alloc.PlanArray<std::string>(message.reserved_name_size());
    PlanAllocationSize(message.enum_type(), full_name_size, alloc);
    PlanAllocationSize(message.oneof_decl(), full_name_size, alloc);
  }
}